

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

DynamicObject * __thiscall
Js::JavascriptLibrary::CreateObject
          (JavascriptLibrary *this,bool allowObjectHeaderInlining,
          PropertyIndex requestedInlineSlotCapacity)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DynamicType *type;
  DynamicObject *pDVar4;
  
  if (this->objectTypes[0].ptr == (DynamicType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x1a6d,"(GetObjectType())","GetObjectType()");
    if (!bVar2) goto LAB_00a9f1ca;
    *puVar3 = 0;
  }
  if (this->objectHeaderInlinedTypes[0].ptr == (DynamicType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x1a6e,"(GetObjectHeaderInlinedType())",
                                "GetObjectHeaderInlinedType()");
    if (!bVar2) {
LAB_00a9f1ca:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (allowObjectHeaderInlining) {
    bVar2 = FunctionBody::DoObjectHeaderInliningForObjectLiteral((uint)requestedInlineSlotCapacity);
    if (bVar2) {
      type = GetObjectHeaderInlinedLiteralType(this,requestedInlineSlotCapacity);
      goto LAB_00a9f1b3;
    }
  }
  type = GetObjectLiteralType(this,requestedInlineSlotCapacity);
LAB_00a9f1b3:
  pDVar4 = DynamicObject::New(this->recycler,type);
  return pDVar4;
}

Assistant:

DynamicObject* JavascriptLibrary::CreateObject(
        const bool allowObjectHeaderInlining,
        const PropertyIndex requestedInlineSlotCapacity)
    {
        Assert(GetObjectType());
        Assert(GetObjectHeaderInlinedType());

        const bool useObjectHeaderInlining =
            allowObjectHeaderInlining && FunctionBody::DoObjectHeaderInliningForObjectLiteral(requestedInlineSlotCapacity);
        DynamicType *const type =
            useObjectHeaderInlining
            ? GetObjectHeaderInlinedLiteralType(requestedInlineSlotCapacity)
            : GetObjectLiteralType(requestedInlineSlotCapacity);
        return DynamicObject::New(GetRecycler(), type);
    }